

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     operate<andres::marray_detail::Assign<int,int>,int,int,false,std::allocator<unsigned_long>>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,
               View<int,_false,_std::allocator<unsigned_long>_> *w)

{
  CoordinateOrder CVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  runtime_error *this;
  reference piVar5;
  reference piVar6;
  reference piVar7;
  reference piVar8;
  int *piVar9;
  reference piVar10;
  reference piVar11;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar12;
  Marray<int,_std::allocator<unsigned_long>_> m;
  const_iterator itW;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_a8;
  long local_78;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_60;
  
  if (((v->geometry_).size_ == 0) || ((w->geometry_).size_ == 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
LAB_001f1d6f:
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_001f1d6f;
  }
  sVar3 = (w->geometry_).dimension_;
  if (sVar3 != 0) {
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_001f1d6f;
    }
    if ((v->geometry_).dimension_ != sVar3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_001f1d6f;
    }
    if (sVar3 != 0) {
      if (v->data_ != (pointer)0x0) {
        uVar12 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar12) goto LAB_001f1510;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar12);
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(w,uVar12);
          if (sVar3 != sVar4) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_001f1d6f;
          }
          uVar12 = uVar12 + 1;
        } while (v->data_ != (pointer)0x0);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_001f1d6f;
    }
  }
LAB_001f1510:
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_001f1d6f;
  }
  if ((w->geometry_).dimension_ == 0) {
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    local_60.view_._0_4_ = *piVar7;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    if ((v->geometry_).isSimple_ == true) {
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar3 = (v->geometry_).size_;
      if (sVar3 == 0) {
        return;
      }
      sVar4 = 0;
      do {
        piVar7[sVar4] = (int)local_60.view_;
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
      return;
    }
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_001f1d6f;
    }
    switch((v->geometry_).dimension_) {
    case 1:
      local_a8.view_._0_4_ = 0;
      piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar3 != 0) {
        uVar12 = 0;
        do {
          *piVar9 = (int)local_60.view_;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar9 = piVar9 + sVar3;
          uVar12 = uVar12 + 1;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar12 < sVar3);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      break;
    case 2:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,piVar7);
      return;
    case 3:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      if (sVar3 != 0) {
        uVar12 = 0;
        do {
          OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(v,&local_60,piVar7);
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,2);
          piVar7 = piVar7 + sVar3;
          uVar12 = uVar12 + 1;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
        } while (uVar12 < sVar3);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      sVar3 = 2;
      goto LAB_001f19a1;
    case 4:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,piVar7);
      return;
    default:
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 5) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 6) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 7) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 8) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 9) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 10) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar7);
        return;
      }
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
      Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
      while (bVar2 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8), bVar2
            ) {
        piVar10 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
        *piVar10 = (int)local_60.view_;
        Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
      }
LAB_001f1cc8:
      if (local_a8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      uVar12 = (long)local_a8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_a8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_a8.index_ =
           (size_t)local_a8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
LAB_001f15bb:
      operator_delete((void *)local_a8.index_,uVar12);
      return;
    }
  }
  else {
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
    piVar7 = v->data_;
    if ((piVar7 != (reference)0x0) && (piVar8 = w->data_, piVar8 != (reference)0x0)) {
      piVar5 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         (v,(v->geometry_).size_ - 1);
      piVar6 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         (w,(w->geometry_).size_ - 1);
      if (((piVar7 <= piVar8) && (piVar8 <= piVar5)) || ((piVar8 <= piVar7 && (piVar7 <= piVar6))))
      {
        Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
                  ((Marray<int,std::allocator<unsigned_long>> *)&local_a8,w);
        operate<andres::marray_detail::Assign<int,int>,int,int,false,std::allocator<unsigned_long>>
                  (v,&local_a8);
        operator_delete((void *)CONCAT44(local_a8.view_._4_4_,local_a8.view_._0_4_),local_78 << 2);
        uVar12 = (long)local_a8.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * 0x18;
        goto LAB_001f15bb;
      }
    }
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    CVar1 = (v->geometry_).coordinateOrder_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
    if ((CVar1 == (w->geometry_).coordinateOrder_) &&
       ((View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v),
        (v->geometry_).isSimple_ == true &&
        (View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w),
        (w->geometry_).isSimple_ == true)))) {
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (w,(int *)&local_a8);
      sVar3 = (v->geometry_).size_;
      if (sVar3 == 0) {
        return;
      }
      sVar4 = 0;
      do {
        piVar7[sVar4] = piVar8[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
      return;
    }
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_001f1d6f;
    }
    switch((v->geometry_).dimension_) {
    case 1:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      local_a8.view_._0_4_ = 0;
      piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (w,(int *)&local_a8);
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar3 != 0) {
        uVar12 = 0;
        do {
          *piVar7 = *piVar9;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar7 = piVar7 + sVar3;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides(w,0);
          piVar9 = piVar9 + sVar3;
          uVar12 = uVar12 + 1;
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar12 < sVar3);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::shape(w,0);
      v = w;
      break;
    case 2:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (w,(int *)&local_a8);
      OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,piVar7,piVar8);
      return;
    case 3:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (w,(int *)&local_a8);
      OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,piVar7,piVar8);
      return;
    case 4:
      local_a8.view_._0_4_ = 0;
      piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (w,(int *)&local_a8);
      OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,piVar7,piVar8);
      return;
    default:
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 5) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 6) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 7) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 8) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 9) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar3 == 10) {
        local_a8.view_._0_4_ = 0;
        piVar7 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (w,(int *)&local_a8);
        OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(v,w,piVar7,piVar8);
        return;
      }
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
      Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
      Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_60,w,0);
      while (bVar2 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8), bVar2
            ) {
        bVar2 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
        Assert<bool>(bVar2);
        piVar10 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
        piVar11 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&local_60);
        *piVar10 = *piVar11;
        Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
        Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_60);
      }
      bVar2 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
      Assert<bool>(!bVar2);
      if (local_60.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001f1cc8;
    }
  }
  sVar3 = 0;
LAB_001f19a1:
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,sVar3);
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}